

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BigIndex __thiscall Js::JavascriptArray::BigIndex::operator+(BigIndex *this,uint32 delta)

{
  bool bVar1;
  BigIndex BVar2;
  uint32 local_28;
  uint32 local_24;
  uint32 newIndex;
  uint32 delta_local;
  BigIndex *this_local;
  uint64 local_10;
  
  local_24 = delta;
  _newIndex = this;
  bVar1 = IsSmallIndex(this);
  if (bVar1) {
    bVar1 = UInt32Math::Add(this->index,local_24,&local_28);
    if (bVar1) {
      BigIndex((BigIndex *)&this_local,(ulong)this->index + (ulong)local_24);
    }
    else {
      BigIndex((BigIndex *)&this_local,local_28);
    }
  }
  else {
    BigIndex((BigIndex *)&this_local,this->bigIndex + (ulong)local_24);
  }
  BVar2._4_4_ = 0;
  BVar2.index = (uint)this_local;
  BVar2.bigIndex = local_10;
  return BVar2;
}

Assistant:

JavascriptArray::BigIndex JavascriptArray::BigIndex::operator+(uint32 delta) const
    {
        if (IsSmallIndex())
        {
            uint32 newIndex;
            if (UInt32Math::Add(index, delta, &newIndex))
            {
                return static_cast<uint64>(index) + static_cast<uint64>(delta);
            }
            else
            {
                return newIndex; // ok if newIndex == InvalidIndex
            }
        }
        else
        {
            return bigIndex + static_cast<uint64>(delta);
        }
    }